

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_deriveBlockSplitsHelper
               (seqStoreSplits *splits,size_t startIdx,size_t endIdx,ZSTD_CCtx *zc,
               seqStore_t *origSeqStore)

{
  uint uVar1;
  ulong startIdx_00;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  seqStore_t *in_RCX;
  seqStoreSplits *in_RDX;
  seqStoreSplits *in_RSI;
  long *in_RDI;
  ZSTD_CCtx *in_R8;
  size_t midIdx;
  size_t estimatedSecondHalfSize;
  size_t estimatedFirstHalfSize;
  size_t estimatedOriginalSize;
  seqStore_t *secondHalfSeqStore;
  seqStore_t *firstHalfSeqStore;
  seqStore_t *fullSeqStoreChunk;
  size_t in_stack_ffffffffffffff98;
  undefined4 uVar5;
  seqStore_t *in_stack_ffffffffffffffa8;
  seqStore_t *in_stack_ffffffffffffffb0;
  seqStore_t *origSeqStore_00;
  
  origSeqStore_00 = (seqStore_t *)&in_RCX[0x2e].llCode;
  startIdx_00 = (ulong)((long)&in_RDX->splitLocations + (long)&in_RSI->splitLocations) >> 1;
  if (in_RSI <= in_RDX) {
    if ((299 < (ulong)((long)in_RDX - (long)in_RSI)) && ((ulong)in_RDI[1] < 0xc4)) {
      ZSTD_deriveSeqStoreChunk
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,startIdx_00,
                 in_stack_ffffffffffffff98);
      ZSTD_deriveSeqStoreChunk
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,startIdx_00,
                 in_stack_ffffffffffffff98);
      ZSTD_deriveSeqStoreChunk
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,startIdx_00,
                 in_stack_ffffffffffffff98);
      uVar5 = (undefined4)startIdx_00;
      sVar2 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(in_RCX,in_R8);
      sVar3 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(in_RCX,in_R8);
      sVar4 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(in_RCX,in_R8);
      uVar1 = ZSTD_isError(0x2c163d);
      if ((uVar1 == 0) &&
         (((uVar1 = ZSTD_isError(0x2c164c), uVar1 == 0 &&
           (uVar1 = ZSTD_isError(0x2c165b), uVar1 == 0)) && (sVar3 + sVar4 < sVar2)))) {
        ZSTD_deriveBlockSplitsHelper(in_RSI,(size_t)in_RDX,(size_t)in_RCX,in_R8,origSeqStore_00);
        *(undefined4 *)(*in_RDI + in_RDI[1] * 4) = uVar5;
        in_RDI[1] = in_RDI[1] + 1;
        ZSTD_deriveBlockSplitsHelper(in_RSI,(size_t)in_RDX,(size_t)in_RCX,in_R8,origSeqStore_00);
      }
    }
    return;
  }
  __assert_fail("endIdx >= startIdx",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x6089,
                "void ZSTD_deriveBlockSplitsHelper(seqStoreSplits *, size_t, size_t, ZSTD_CCtx *, const seqStore_t *)"
               );
}

Assistant:

static void
ZSTD_deriveBlockSplitsHelper(seqStoreSplits* splits, size_t startIdx, size_t endIdx,
                             ZSTD_CCtx* zc, const seqStore_t* origSeqStore)
{
    seqStore_t* const fullSeqStoreChunk = &zc->blockSplitCtx.fullSeqStoreChunk;
    seqStore_t* const firstHalfSeqStore = &zc->blockSplitCtx.firstHalfSeqStore;
    seqStore_t* const secondHalfSeqStore = &zc->blockSplitCtx.secondHalfSeqStore;
    size_t estimatedOriginalSize;
    size_t estimatedFirstHalfSize;
    size_t estimatedSecondHalfSize;
    size_t midIdx = (startIdx + endIdx)/2;

    DEBUGLOG(5, "ZSTD_deriveBlockSplitsHelper: startIdx=%zu endIdx=%zu", startIdx, endIdx);
    assert(endIdx >= startIdx);
    if (endIdx - startIdx < MIN_SEQUENCES_BLOCK_SPLITTING || splits->idx >= ZSTD_MAX_NB_BLOCK_SPLITS) {
        DEBUGLOG(6, "ZSTD_deriveBlockSplitsHelper: Too few sequences (%zu)", endIdx - startIdx);
        return;
    }
    ZSTD_deriveSeqStoreChunk(fullSeqStoreChunk, origSeqStore, startIdx, endIdx);
    ZSTD_deriveSeqStoreChunk(firstHalfSeqStore, origSeqStore, startIdx, midIdx);
    ZSTD_deriveSeqStoreChunk(secondHalfSeqStore, origSeqStore, midIdx, endIdx);
    estimatedOriginalSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(fullSeqStoreChunk, zc);
    estimatedFirstHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(firstHalfSeqStore, zc);
    estimatedSecondHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(secondHalfSeqStore, zc);
    DEBUGLOG(5, "Estimated original block size: %zu -- First half split: %zu -- Second half split: %zu",
             estimatedOriginalSize, estimatedFirstHalfSize, estimatedSecondHalfSize);
    if (ZSTD_isError(estimatedOriginalSize) || ZSTD_isError(estimatedFirstHalfSize) || ZSTD_isError(estimatedSecondHalfSize)) {
        return;
    }
    if (estimatedFirstHalfSize + estimatedSecondHalfSize < estimatedOriginalSize) {
        DEBUGLOG(5, "split decided at seqNb:%zu", midIdx);
        ZSTD_deriveBlockSplitsHelper(splits, startIdx, midIdx, zc, origSeqStore);
        splits->splitLocations[splits->idx] = (U32)midIdx;
        splits->idx++;
        ZSTD_deriveBlockSplitsHelper(splits, midIdx, endIdx, zc, origSeqStore);
    }
}